

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O2

void __thiscall
EmmyDebuggerManager::RemoveBreakpoint(EmmyDebuggerManager *this,string *file,int line)

{
  bool bVar1;
  const_iterator __position;
  shared_ptr<BreakPoint> bp;
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::mutex::lock(&this->breakpointsMtx);
  __position._M_current =
       (this->breakpoints).
       super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (this->breakpoints).
        super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    std::__shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               &(__position._M_current)->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)
    ;
    if ((local_40._M_ptr)->line == line) {
      bVar1 = CompareIgnoreCase(&(local_40._M_ptr)->file,file);
      if (bVar1) goto LAB_0015a6d4;
      std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::erase
                (&this->breakpoints,__position);
      bVar1 = false;
    }
    else {
LAB_0015a6d4:
      __position._M_current = __position._M_current + 1;
      bVar1 = true;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  } while (bVar1);
  RefreshLineSet(this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointsMtx);
  return;
}

Assistant:

void EmmyDebuggerManager::RemoveBreakpoint(const std::string& file, int line)
{
	std::lock_guard<std::mutex> lock(breakpointsMtx);
	auto it = breakpoints.begin();
	while (it != breakpoints.end())
	{
		const auto bp = *it;
		if (bp->line == line && CompareIgnoreCase(bp->file, file) == 0)
		{
			breakpoints.erase(it);
			break;
		}
		++it;
	}
	RefreshLineSet();
}